

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

Curl_addrinfo * addr_first_match(Curl_addrinfo *addr,int family)

{
  for (; (addr != (Curl_addrinfo *)0x0 && (addr->ai_family != family)); addr = addr->ai_next) {
  }
  return addr;
}

Assistant:

static const struct Curl_addrinfo *
addr_first_match(const struct Curl_addrinfo *addr, int family)
{
  while(addr) {
    if(addr->ai_family == family)
      return addr;
    addr = addr->ai_next;
  }
  return NULL;
}